

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemanager.c
# Opt level: O0

filemanager_time * filemanager_getModifiedDate(filemanager_fileinfo *fileinfo)

{
  filemanager_time *__dest;
  tm *__src;
  long in_RDI;
  filemanager_time *time;
  filemanager_time *tmp;
  
  __dest = (filemanager_time *)malloc(0x38);
  __src = localtime((time_t *)(in_RDI + 0x58));
  memcpy(__dest,__src,0x38);
  return __dest;
}

Assistant:

filemanager_time *filemanager_getModifiedDate(filemanager_fileinfo *fileinfo) {
	filemanager_time *tmp;
	filemanager_time *time;

	time = (filemanager_time *) malloc(sizeof(filemanager_time));

	tmp = localtime(&fileinfo->st_mtime);
	memcpy(time, tmp, sizeof(filemanager_time));

	return time;
}